

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall
restincurl::Request::AddFileAsMimeData
          (Request *this,string *path,string *name,string *remoteName,string *mimeType)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *local_58;
  curl_mimepart *part;
  string *mimeType_local;
  string *remoteName_local;
  string *name_local;
  string *path_local;
  Request *this_local;
  
  InitMime(this);
  if (this->mime_ != (curl_mime *)0x0) {
    uVar1 = curl_mime_addpart(this->mime_);
    uVar2 = std::__cxx11::string::c_str();
    curl_mime_filedata(uVar1,uVar2);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_58 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_58 = "file";
    }
    curl_mime_name(uVar1,local_58);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      curl_mime_filename(uVar1,uVar2);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      curl_mime_type(uVar1,uVar2);
    }
    return;
  }
  __assert_fail("mime_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x21b,
                "void restincurl::Request::AddFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

void AddFileAsMimeData(const std::string& path,
                               const std::string& name,
                               const std::string& remoteName,
                               const std::string& mimeType) {

            InitMime();
            assert(mime_);
            auto * part = curl_mime_addpart(mime_);
            curl_mime_filedata(part, path.c_str());
            curl_mime_name(part, name.empty() ? "file" :name.c_str());

            if (!remoteName.empty()) {
                curl_mime_filename(part, remoteName.c_str());
            }

            if (!mimeType.empty()) {
                curl_mime_type(part, mimeType.c_str());
            }
        }